

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

BOOL __thiscall Js::LocalsWalker::GetLocal(LocalsWalker *this,int i,ResolvedObject *pResolvedObject)

{
  VariableWalkerBase *this_00;
  bool bVar1;
  int iVar2;
  Type *ppVVar3;
  int count;
  VariableWalkerBase *variableWalker;
  int j;
  ResolvedObject *pResolvedObject_local;
  int i_local;
  LocalsWalker *this_local;
  
  if ((this->pVarWalkers !=
       (List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        *)0x0) &&
     (iVar2 = JsUtil::
              ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>::Count
                        (&this->pVarWalkers->
                          super_ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
                        ), iVar2 != 0)) {
    pResolvedObject_local._4_4_ = i;
    for (variableWalker._4_4_ = 0;
        iVar2 = JsUtil::
                ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>::
                Count(&this->pVarWalkers->
                       super_ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
                     ), variableWalker._4_4_ < iVar2;
        variableWalker._4_4_ = variableWalker._4_4_ + 1) {
      ppVVar3 = JsUtil::
                List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item(this->pVarWalkers,variableWalker._4_4_);
      this_00 = *ppVVar3;
      bVar1 = ShouldMakeGroups(this);
      if ((bVar1) && (bVar1 = VariableWalkerBase::IsInGroup(this_00), bVar1)) {
        return 0;
      }
      iVar2 = (*(this_00->super_IDiagObjectModelWalkerBase)._vptr_IDiagObjectModelWalkerBase[1])();
      if ((int)pResolvedObject_local._4_4_ < iVar2) {
        iVar2 = (**(this_00->super_IDiagObjectModelWalkerBase)._vptr_IDiagObjectModelWalkerBase)
                          (this_00,(ulong)pResolvedObject_local._4_4_,pResolvedObject);
        return iVar2;
      }
      pResolvedObject_local._4_4_ = pResolvedObject_local._4_4_ - iVar2;
    }
  }
  return 0;
}

Assistant:

BOOL LocalsWalker::GetLocal(int i, ResolvedObject* pResolvedObject)
    {
        if (!pVarWalkers || pVarWalkers->Count() == 0)
        {
            return FALSE;
        }

        for (int j = 0; j < pVarWalkers->Count(); ++j)
        {
            VariableWalkerBase *variableWalker = pVarWalkers->Item(j);

            if (!ShouldMakeGroups() || !variableWalker->IsInGroup())
            {
                int count = variableWalker->GetChildrenCount();

                if (i < count)
                {
                    return variableWalker->Get(i, pResolvedObject);
                }
                i -= count;
            }
            else
            {
                // We've finished with all walkers for the current locals level so
                // break out in order to handle the groups.
                break;
            }
        }

        return FALSE;
    }